

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare
          (DebugInfoManager *this,Instruction *inst)

{
  CommonDebugInfoInstructions CVar1;
  uint32_t uVar2;
  OpenCLDebugInfo100Instructions OVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  
  CVar1 = Instruction::GetCommonDebugOpcode(inst);
  if (CVar1 == CommonDebugInfoDebugValue) {
    uVar2 = Instruction::GetSingleWordOperand(inst,6);
    pIVar5 = GetDbgInst(this,uVar2);
    if ((pIVar5 != (Instruction *)0x0) &&
       ((int)((ulong)((long)(pIVar5->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pIVar5->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 5)) {
      uVar2 = Instruction::GetSingleWordOperand(pIVar5,4);
      pIVar5 = GetDbgInst(this,uVar2);
      if (pIVar5 != (Instruction *)0x0) {
        OVar3 = Instruction::GetOpenCL100DebugOpcode(inst);
        if (OVar3 == OpenCLDebugInfo100InstructionsMax) {
          uVar2 = GetVulkanDebugOperation(this,pIVar5);
        }
        else {
          uVar2 = Instruction::GetSingleWordOperand(pIVar5,4);
        }
        if (uVar2 == 0) {
          uVar2 = Instruction::GetSingleWordOperand(inst,5);
          if ((this->context_->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            __assert_fail("false && \"Checking a DebugValue can be used for declare needs DefUseManager\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                          ,0x28c,
                          "uint32_t spvtools::opt::analysis::DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(Instruction *)"
                         );
          }
          pIVar5 = DefUseManager::GetDef
                             ((this->context_->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,uVar2);
          if ((pIVar5->opcode_ == OpVariable) &&
             (uVar4 = Instruction::GetSingleWordOperand(pIVar5,2), uVar4 == 7)) {
            return uVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

uint32_t DebugInfoManager::GetVariableIdOfDebugValueUsedForDeclare(
    Instruction* inst) {
  if (inst->GetCommonDebugOpcode() != CommonDebugInfoDebugValue) return 0;

  auto* expr =
      GetDbgInst(inst->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  if (expr == nullptr) return 0;
  if (expr->NumOperands() != kDebugExpressOperandOperationIndex + 1) return 0;

  auto* operation = GetDbgInst(
      expr->GetSingleWordOperand(kDebugExpressOperandOperationIndex));
  if (operation == nullptr) return 0;

  // OpenCL.DebugInfo.100 contains a literal for the operation, Vulkan uses an
  // OpConstant.
  if (inst->IsOpenCL100DebugInstr()) {
    if (operation->GetSingleWordOperand(kDebugOperationOperandOperationIndex) !=
        OpenCLDebugInfo100Deref) {
      return 0;
    }
  } else {
    uint32_t operation_const = GetVulkanDebugOperation(operation);
    if (operation_const != NonSemanticShaderDebugInfo100Deref) {
      return 0;
    }
  }

  uint32_t var_id =
      inst->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
  if (!context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
    assert(false &&
           "Checking a DebugValue can be used for declare needs DefUseManager");
    return 0;
  }

  auto* var = context()->get_def_use_mgr()->GetDef(var_id);
  if (var->opcode() == spv::Op::OpVariable &&
      spv::StorageClass(
          var->GetSingleWordOperand(kOpVariableOperandStorageClassIndex)) ==
          spv::StorageClass::Function) {
    return var_id;
  }
  return 0;
}